

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_buffer_parameteriv(NegativeTestContext *ctx)

{
  GLuint *params_00;
  NegativeTestContext *pNVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18 [2];
  GLuint buf;
  GLint params;
  NegativeTestContext *ctx_local;
  
  local_18[1] = 0xffffffff;
  _buf = ctx;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,local_18);
  glu::CallLogWrapper::glBindBuffer(&_buf->super_CallLogWrapper,0x8892,local_18[0]);
  pNVar1 = _buf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or value is not an accepted value.",&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  params_00 = local_18 + 1;
  glu::CallLogWrapper::glGetBufferParameteriv
            (&_buf->super_CallLogWrapper,0xffffffff,0x8764,(GLint *)params_00);
  NegativeTestContext::expectError(_buf,0x500);
  glu::CallLogWrapper::glGetBufferParameteriv
            (&_buf->super_CallLogWrapper,0x8892,0xffffffff,(GLint *)params_00);
  NegativeTestContext::expectError(_buf,0x500);
  glu::CallLogWrapper::glGetBufferParameteriv
            (&_buf->super_CallLogWrapper,0xffffffff,0xffffffff,(GLint *)params_00);
  NegativeTestContext::expectError(_buf,0x500);
  NegativeTestContext::endSection(_buf);
  pNVar1 = _buf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glBindBuffer(&_buf->super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glGetBufferParameteriv
            (&_buf->super_CallLogWrapper,0x8892,0x8764,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_buf,0x502);
  NegativeTestContext::endSection(_buf);
  glu::CallLogWrapper::glDeleteBuffers(&_buf->super_CallLogWrapper,1,local_18);
  return;
}

Assistant:

void get_buffer_parameteriv (NegativeTestContext& ctx)
{
	GLint	params	= -1;
	GLuint	buf;
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, buf);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or value is not an accepted value.");
	ctx.glGetBufferParameteriv(-1, GL_BUFFER_SIZE, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetBufferParameteriv(GL_ARRAY_BUFFER, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetBufferParameteriv(-1, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target.");
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.glGetBufferParameteriv(GL_ARRAY_BUFFER, GL_BUFFER_SIZE, &params);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteBuffers(1, &buf);
}